

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSet::exclusiveOr(UnicodeSet *this,UChar32 *other,int32_t otherLen,int8_t polarity)

{
  UBool UVar1;
  int local_38;
  int local_34;
  UChar32 b;
  UChar32 a;
  int32_t k;
  int32_t j;
  int32_t i;
  UErrorCode status;
  int8_t polarity_local;
  UChar32 *pUStack_18;
  int32_t otherLen_local;
  UChar32 *other_local;
  UnicodeSet *this_local;
  
  i._3_1_ = polarity;
  status = otherLen;
  pUStack_18 = other;
  other_local = (UChar32 *)this;
  UVar1 = isFrozen(this);
  if ((UVar1 == '\0') && (UVar1 = isBogus(this), UVar1 == '\0')) {
    j = 0;
    ensureBufferCapacity(this,this->len + status,&j);
    UVar1 = ::U_FAILURE(j);
    if (UVar1 == '\0') {
      b = 0;
      local_34 = *this->list;
      k = 1;
      if ((i._3_1_ == '\x01') || (i._3_1_ == '\x02')) {
        local_38 = 0;
        if (*pUStack_18 == 0) {
          local_38 = pUStack_18[1];
        }
        a = (UChar32)(*pUStack_18 == 0);
      }
      else {
        a = 1;
        local_38 = *pUStack_18;
      }
      do {
        while (local_34 < local_38) {
          this->buffer[b] = local_34;
          local_34 = this->list[k];
          b = b + 1;
          k = k + 1;
        }
        if (local_38 < local_34) {
          this->buffer[b] = local_38;
          local_38 = pUStack_18[a];
          b = b + 1;
        }
        else {
          if (local_34 == 0x110000) {
            this->buffer[b] = 0x110000;
            this->len = b + 1;
            swapBuffers(this);
            releasePattern(this);
            return;
          }
          local_34 = this->list[k];
          local_38 = pUStack_18[a];
          k = k + 1;
        }
        a = a + 1;
      } while( true );
    }
  }
  return;
}

Assistant:

void UnicodeSet::exclusiveOr(const UChar32* other, int32_t otherLen, int8_t polarity) {
    if (isFrozen() || isBogus()) {
        return;
    }
    UErrorCode status = U_ZERO_ERROR;
    ensureBufferCapacity(len + otherLen, status);
    if (U_FAILURE(status)) {
        return;
    }

    int32_t i = 0, j = 0, k = 0;
    UChar32 a = list[i++];
    UChar32 b;
    if (polarity == 1 || polarity == 2) {
        b = UNICODESET_LOW;
        if (other[j] == UNICODESET_LOW) { // skip base if already LOW
            ++j;
            b = other[j];
        }
    } else {
        b = other[j++];
    }
    // simplest of all the routines
    // sort the values, discarding identicals!
    for (;;) {
        if (a < b) {
            buffer[k++] = a;
            a = list[i++];
        } else if (b < a) {
            buffer[k++] = b;
            b = other[j++];
        } else if (a != UNICODESET_HIGH) { // at this point, a == b
            // discard both values!
            a = list[i++];
            b = other[j++];
        } else { // DONE!
            buffer[k++] = UNICODESET_HIGH;
            len = k;
            break;
        }
    }
    swapBuffers();
    releasePattern();
}